

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csnode_bmod.c
# Opt level: O3

int csnode_bmod(int jcol,int jsupno,int fsupc,singlecomplex *dense,singlecomplex *tempv,
               GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 uVar1;
  int iVar2;
  flops_t *pfVar3;
  int_t *piVar4;
  void *pvVar5;
  int_t *piVar6;
  int_t *piVar7;
  int iVar8;
  ulong uVar9;
  uint nrow;
  int iVar10;
  long lVar11;
  int ldm;
  singlecomplex *psVar12;
  
  pfVar3 = stat->ops;
  piVar4 = Glu->xlsub;
  pvVar5 = Glu->lusup;
  piVar6 = Glu->xlusup;
  iVar10 = piVar6[jcol];
  lVar11 = (long)piVar4[fsupc];
  if (piVar4[fsupc] < piVar4[(long)fsupc + 1]) {
    piVar7 = Glu->lsub;
    psVar12 = (singlecomplex *)((long)pvVar5 + (long)iVar10 * 8);
    do {
      iVar2 = piVar7[lVar11];
      *psVar12 = dense[iVar2];
      dense[iVar2].r = 0.0;
      dense[iVar2].i = 0.0;
      lVar11 = lVar11 + 1;
      psVar12 = psVar12 + 1;
      iVar10 = iVar10 + 1;
    } while (lVar11 < piVar4[(long)fsupc + 1]);
  }
  piVar6[(long)jcol + 1] = iVar10;
  iVar10 = jcol - fsupc;
  if (iVar10 != 0 && fsupc <= jcol) {
    iVar2 = piVar6[fsupc];
    ldm = piVar4[(long)fsupc + 1] - piVar4[fsupc];
    nrow = ldm - iVar10;
    iVar8 = piVar6[jcol];
    pfVar3[0x13] = (float)((iVar10 + -1) * iVar10 * 4) + pfVar3[0x13];
    pfVar3[0x14] = (float)(int)(iVar10 * nrow * 8) + pfVar3[0x14];
    psVar12 = (singlecomplex *)((long)pvVar5 + (long)iVar8 * 8);
    clsolve(ldm,iVar10,(singlecomplex *)((long)pvVar5 + (long)iVar2 * 8),psVar12);
    cmatvec(ldm,nrow,iVar10,(singlecomplex *)((long)pvVar5 + ((long)iVar2 + (long)iVar10) * 8),
            psVar12,tempv);
    if (0 < (int)nrow) {
      iVar8 = iVar8 + iVar10;
      uVar9 = 0;
      do {
        uVar1 = *(undefined8 *)((long)pvVar5 + uVar9 * 8 + (long)iVar8 * 8);
        *(ulong *)((long)pvVar5 + uVar9 * 8 + (long)iVar8 * 8) =
             CONCAT44((float)((ulong)uVar1 >> 0x20) - tempv[uVar9].i,(float)uVar1 - tempv[uVar9].r);
        tempv[uVar9].r = 0.0;
        tempv[uVar9].i = 0.0;
        uVar9 = uVar9 + 1;
      } while (uVar9 < nrow);
    }
  }
  return 0;
}

Assistant:

int
csnode_bmod (
	    const int  jcol,	  /* in */
	    const int  jsupno,    /* in */
	    const int  fsupc,     /* in */
	    singlecomplex     *dense,    /* in */
	    singlecomplex     *tempv,    /* working array */
	    GlobalLU_t *Glu,      /* modified */
	    SuperLUStat_t *stat   /* output */
	    )
{
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int            incx = 1, incy = 1;
    singlecomplex         alpha = {-1.0, 0.0},  beta = {1.0, 0.0};
#endif

    singlecomplex   comp_zero = {0.0, 0.0};
    int     nsupc, nsupr, nrow;
    int_t   isub, irow;
    int_t   ufirst, nextlu;
    int_t   *lsub, *xlsub;
    singlecomplex *lusup;
    int_t   *xlusup, luptr;
    flops_t *ops = stat->ops;

    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;

    nextlu = xlusup[jcol];
    
    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = comp_zero;
	++nextlu;
    }

    xlusup[jcol + 1] = nextlu;	/* Initialize xlusup for next column */
    
    if ( fsupc < jcol ) {

	luptr = xlusup[fsupc];
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nsupc = jcol - fsupc;	/* Excluding jcol */
	ufirst = xlusup[jcol];	/* Points to the beginning of column
				   jcol in supernode L\U(jsupno). */
	nrow = nsupr - nsupc;

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	ctrsv_( "L", "N", "U", &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	cgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	clsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );
	cmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc], 
			&lusup[ufirst], &tempv[0] );

	int_t i, iptr; 
        /* Scatter tempv[*] into lusup[*] */
	iptr = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    c_sub(&lusup[iptr], &lusup[iptr], &tempv[i]);
            ++iptr;
	    tempv[i] = comp_zero;
	}
#endif

    }

    return 0;
}